

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

Qiniu_Error
Qiniu_Io_PutBuffer(Qiniu_Client *self,Qiniu_Io_PutRet *ret,char *uptoken,char *key,char *buf,
                  size_t fsize,Qiniu_Io_PutExtra *extra)

{
  Qiniu_Bool QVar1;
  uint uVar2;
  char *pcVar3;
  Qiniu_Error QVar4;
  char *bucketName;
  char *accessKey;
  Qiniu_Io_PutRet *local_48;
  Qiniu_Io_form form;
  
  accessKey = (char *)0x0;
  bucketName = (char *)0x0;
  QVar1 = Qiniu_Utils_Extract_Bucket(uptoken,&accessKey,&bucketName);
  if (QVar1 == 0) {
    pcVar3 = "parse uptoken failed";
    uVar2 = 400;
  }
  else {
    local_48 = ret;
    Qiniu_Io_form_init(&form,uptoken,key,&extra);
    pcVar3 = "";
    if (key != (char *)0x0) {
      pcVar3 = key;
    }
    curl_formadd(&form,&form.lastptr,1,"file",0xb,pcVar3,0xc,buf,0xd,fsize,0x11);
    QVar4 = Qiniu_Io_call(self,accessKey,bucketName,local_48,form.formpost,extra);
    pcVar3 = QVar4.message;
    uVar2 = QVar4.code;
    Qiniu_Free(accessKey);
    Qiniu_Free(bucketName);
  }
  QVar4._4_4_ = 0;
  QVar4.code = uVar2;
  QVar4.message = pcVar3;
  return QVar4;
}

Assistant:

Qiniu_Error Qiniu_Io_PutBuffer(
    Qiniu_Client *self, Qiniu_Io_PutRet *ret,
    const char *uptoken, const char *key, const char *buf, size_t fsize, Qiniu_Io_PutExtra *extra)
{
    Qiniu_Error err = Qiniu_OK;
    const char *accessKey = NULL, *bucketName = NULL;
    Qiniu_Io_form form;

    if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
    {
        err.code = 400;
        err.message = "parse uptoken failed";
        return err;
    }

    Qiniu_Io_form_init(&form, uptoken, key, &extra);

    if (key == NULL)
    {
        // Use an empty string instead of the NULL pointer to prevent the curl lib from crashing
        // when read it.
        // **NOTICE**: The magic variable $(filename) will be set as empty string.
        key = "";
    }

    curl_formadd(
        &form.formpost, &form.lastptr, CURLFORM_COPYNAME, "file",
        CURLFORM_BUFFER, key, CURLFORM_BUFFERPTR, buf, CURLFORM_BUFFERLENGTH, fsize, CURLFORM_END);
    err = Qiniu_Io_call(self, accessKey, bucketName, ret, form.formpost, extra);

    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    return err;
}